

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O0

char * call_type_to_string(uint8_t call_type,char *string_buf,size_t string_buf_len)

{
  size_t sVar1;
  size_t sVar2;
  size_t len_pmt_type;
  size_t len_call_type;
  size_t string_buf_len_local;
  char *string_buf_local;
  char *pcStack_10;
  uint8_t call_type_local;
  
  sVar1 = strnlen(call_type_str[(int)(call_type & 0xf)],0x14);
  sVar2 = strnlen(pmt_type_str[(int)(uint)call_type >> 4],0x11);
  if (string_buf_len < sVar1 + sVar2 + 1) {
    pcStack_10 = (char *)0x0;
  }
  else {
    snprintf(string_buf,string_buf_len,"%s %s",call_type_str[(int)(call_type & 0xf)],
             pmt_type_str[(int)(uint)call_type >> 4]);
    pcStack_10 = string_buf;
  }
  return pcStack_10;
}

Assistant:

char* call_type_to_string(uint8_t call_type, char *string_buf, size_t string_buf_len) {
    size_t len_call_type, len_pmt_type;

    len_call_type = strnlen(call_type_str[call_type & 0x0f], 20);
    len_pmt_type  = strnlen(pmt_type_str[call_type >> 4], 17);

    if ((len_call_type + len_pmt_type + 1) > string_buf_len) {
        return NULL;
    }

    snprintf(string_buf, string_buf_len, "%s %s",
             call_type_str[call_type & 0x0f],
             pmt_type_str[call_type >> 4]);

    return string_buf;
}